

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

word * Dau_DsdToTruth(char *p,int nVars)

{
  word *pRes;
  int nWords;
  char *p_local;
  
  nWords = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    nWords = 1;
  }
  p_local = p;
  Dau_DsdTtElems();
  pRes = Dau_DsdTtElems::pTtElems[0xc];
  if (0xc < nVars) {
    __assert_fail("nVars <= DAU_MAX_VAR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                  ,0x266,"word *Dau_DsdToTruth(char *, int)");
  }
  if (*p == '1') {
    if (p[1] == '\0') {
      Abc_TtConst1(Dau_DsdTtElems::pTtElems[0xc],nWords);
      goto LAB_00432f72;
    }
  }
  else if ((*p == '0') && (p[1] == '\0')) {
    Abc_TtConst0(Dau_DsdTtElems::pTtElems[0xc],nWords);
    goto LAB_00432f72;
  }
  Dau_DsdComputeMatches(p);
  Dau_DsdToTruth_rec(p,&p_local,Dau_DsdComputeMatches::pMatches,Dau_DsdTtElems::pTtElems,pRes,nVars)
  ;
  p = p_local;
LAB_00432f72:
  p_local = p + 1;
  if (p[1] == '\0') {
    return pRes;
  }
  __assert_fail("*++p == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                ,0x26d,"word *Dau_DsdToTruth(char *, int)");
}

Assistant:

word * Dau_DsdToTruth( char * p, int nVars )
{
    int nWords = Abc_TtWordNum( nVars );
    word ** pTtElems = Dau_DsdTtElems();
    word * pRes = pTtElems[DAU_MAX_VAR];
    assert( nVars <= DAU_MAX_VAR );
    if ( Dau_DsdIsConst0(p) )
        Abc_TtConst0( pRes, nWords );
    else if ( Dau_DsdIsConst1(p) )
        Abc_TtConst1( pRes, nWords );
    else
        Dau_DsdToTruth_rec( p, &p, Dau_DsdComputeMatches(p), pTtElems, pRes, nVars );
    assert( *++p == 0 );
    return pRes;
}